

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O0

unique_ptr<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>_>
 __thiscall
wabt::intrusive_list<(anonymous_namespace)::TestObject>::extract_back
          (intrusive_list<(anonymous_namespace)::TestObject> *this)

{
  pointer __p;
  bool bVar1;
  intrusive_list<(anonymous_namespace)::TestObject> *in_RSI;
  TestObject *node;
  intrusive_list<(anonymous_namespace)::TestObject> *this_local;
  
  bVar1 = empty(in_RSI);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/intrusive-list.h"
                  ,0x1ec,
                  "std::unique_ptr<T> wabt::intrusive_list<(anonymous namespace)::TestObject>::extract_back() [T = (anonymous namespace)::TestObject]"
                 );
  }
  __p = in_RSI->last_;
  if (in_RSI->first_ == in_RSI->last_) {
    in_RSI->last_ = (TestObject *)0x0;
    in_RSI->first_ = (TestObject *)0x0;
  }
  else {
    in_RSI->last_ =
         (in_RSI->last_->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_;
    (in_RSI->last_->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ =
         (TestObject *)0x0;
  }
  (__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).prev_ = (TestObject *)0x0;
  (__p->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_ = (TestObject *)0x0;
  in_RSI->size_ = in_RSI->size_ - 1;
  std::
  unique_ptr<(anonymous_namespace)::TestObject,std::default_delete<(anonymous_namespace)::TestObject>>
  ::unique_ptr<std::default_delete<(anonymous_namespace)::TestObject>,void>
            ((unique_ptr<(anonymous_namespace)::TestObject,std::default_delete<(anonymous_namespace)::TestObject>>
              *)this,__p);
  return (__uniq_ptr_data<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>,_true,_true>
          )(__uniq_ptr_data<(anonymous_namespace)::TestObject,_std::default_delete<(anonymous_namespace)::TestObject>,_true,_true>
            )this;
}

Assistant:

inline std::unique_ptr<T> intrusive_list<T>::extract_back() {
  assert(!empty());
  T* node = last_;
  if (first_ == last_) {
    first_ = last_ = nullptr;
  } else {
    last_ = last_->prev_;
    last_->next_ = nullptr;
  }
  node->next_ = node->prev_ = nullptr;
  size_--;
  return std::unique_ptr<T>(node);
}